

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

Abc_Cex_t * Vga_ManDeriveCex(Vta_Man_t *p)

{
  int iVar1;
  sat_solver2 *s;
  int iVar2;
  int iVar3;
  int iVar4;
  Abc_Cex_t *pAVar5;
  bool bVar6;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Vta_Obj_t *pThis;
  Abc_Cex_t *pCex;
  Vta_Man_t *p_local;
  
  iVar2 = Gia_ManRegNum(p->pGia);
  iVar3 = Gia_ManPiNum(p->pGia);
  pAVar5 = Abc_CexAlloc(iVar2,iVar3,p->pPars->iFrame + 1);
  pAVar5->iPo = 0;
  pAVar5->iFrame = p->pPars->iFrame;
  local_2c = 1;
  while( true ) {
    bVar6 = false;
    if (local_2c < p->nObjs) {
      pObj = (Gia_Obj_t *)Vta_ManObj(p,local_2c);
      bVar6 = false;
      if ((Vta_Obj_t *)pObj != (Vta_Obj_t *)0x0) {
        pGStack_28 = Gia_ManObj(p->pGia,((Vta_Obj_t *)pObj)->iObj);
        bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjIsPi(p->pGia,pGStack_28);
    if (iVar2 != 0) {
      s = p->pSat;
      iVar2 = Vta_ObjId(p,(Vta_Obj_t *)pObj);
      iVar2 = sat_solver2_var_value(s,iVar2);
      if (iVar2 != 0) {
        iVar2 = pAVar5->nRegs;
        iVar3 = *(int *)&pObj->field_0x4;
        iVar1 = pAVar5->nPis;
        iVar4 = Gia_ObjCioId(pGStack_28);
        Abc_InfoSetBit((uint *)(pAVar5 + 1),iVar2 + iVar3 * iVar1 + iVar4);
      }
    }
    local_2c = local_2c + 1;
  }
  return pAVar5;
}

Assistant:

Abc_Cex_t * Vga_ManDeriveCex( Vta_Man_t * p )
{
    Abc_Cex_t * pCex;
    Vta_Obj_t * pThis;
    Gia_Obj_t * pObj;
    int i;
    pCex = Abc_CexAlloc( Gia_ManRegNum(p->pGia), Gia_ManPiNum(p->pGia), p->pPars->iFrame+1 );
    pCex->iPo = 0;
    pCex->iFrame = p->pPars->iFrame;
    Vta_ManForEachObjObj( p, pThis, pObj, i )
        if ( Gia_ObjIsPi(p->pGia, pObj) && sat_solver2_var_value(p->pSat, Vta_ObjId(p, pThis)) )
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + pThis->iFrame * pCex->nPis + Gia_ObjCioId(pObj) );
    return pCex;
}